

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

size_t mi_debug_show_bitmap
                 (char *prefix,char *header,size_t block_count,mi_bitmap_field_t *fields,
                 size_t field_count)

{
  ulong uVar1;
  undefined1 uVar2;
  long in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  bool bVar3;
  _Bool inuse;
  size_t bit;
  uintptr_t field;
  char buf [65];
  size_t i;
  size_t inuse_count;
  size_t bcount;
  ulong local_a0;
  undefined1 local_88 [64];
  undefined1 local_48;
  ulong local_40;
  size_t local_38;
  ulong local_30;
  ulong local_28;
  long local_20;
  ulong local_18;
  undefined8 local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  _mi_message("%s%s:\n",in_RDI,in_RSI);
  local_30 = 0;
  local_38 = 0;
  for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
    uVar1 = *(ulong *)(local_20 + local_40 * 8);
    for (local_a0 = 0; local_a0 < 0x40; local_a0 = local_a0 + 1) {
      if (local_30 < local_18) {
        bVar3 = (1L << ((byte)local_a0 & 0x3f) & uVar1) != 0;
        if (bVar3) {
          local_38 = local_38 + 1;
        }
        uVar2 = 0x2e;
        if (bVar3) {
          uVar2 = 0x78;
        }
        local_88[local_a0] = uVar2;
      }
      else {
        local_88[local_a0] = 0x20;
      }
      local_30 = local_30 + 1;
    }
    local_48 = 0;
    _mi_message("%s  %s\n",local_8,local_88);
  }
  _mi_message("%s  total (\'x\'): %zu\n",local_8,local_38);
  return local_38;
}

Assistant:

static size_t mi_debug_show_bitmap(const char* prefix, const char* header, size_t block_count, mi_bitmap_field_t* fields, size_t field_count ) {
  _mi_message("%s%s:\n", prefix, header);
  size_t bcount = 0;
  size_t inuse_count = 0;
  for (size_t i = 0; i < field_count; i++) {
    char buf[MI_BITMAP_FIELD_BITS + 1];
    uintptr_t field = mi_atomic_load_relaxed(&fields[i]);
    for (size_t bit = 0; bit < MI_BITMAP_FIELD_BITS; bit++, bcount++) {
      if (bcount < block_count) {
        bool inuse = ((((uintptr_t)1 << bit) & field) != 0);
        if (inuse) inuse_count++;
        buf[bit] = (inuse ? 'x' : '.');
      }
      else {
        buf[bit] = ' ';
      }
    }
    buf[MI_BITMAP_FIELD_BITS] = 0;
    _mi_message("%s  %s\n", prefix, buf);
  }
  _mi_message("%s  total ('x'): %zu\n", prefix, inuse_count);
  return inuse_count;
}